

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::MDLImporter::ProcessFrames_3DGS_MDL7
          (MDLImporter *this,IntGroupInfo_MDL7 *groupInfo,IntGroupData_MDL7 *groupData,
          IntSharedData_MDL7 *shared,uchar *szCurrent,uchar **szCurrentOut)

{
  undefined8 uVar1;
  ushort uVar2;
  ushort uVar3;
  uchar *puVar4;
  pointer paVar5;
  pointer paVar6;
  ulong uVar7;
  Logger *pLVar8;
  Triangle_MDL7 *pTVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint qq;
  uint uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  float fVar16;
  IntFrameInfo_MDL7 frame;
  Frame_MDL7 *local_a0;
  aiVector3D local_98;
  MDLImporter *local_88;
  float local_7c;
  uchar **local_78;
  IntSharedData_MDL7 *local_70;
  ulong local_68;
  ulong local_60;
  IntFrameInfo_MDL7 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_88 = this;
  if (szCurrent == (uchar *)0x0) {
    __assert_fail("nullptr != szCurrent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLLoader.cpp"
                  ,0x480,
                  "bool Assimp::MDLImporter::ProcessFrames_3DGS_MDL7(const MDL::IntGroupInfo_MDL7 &, MDL::IntGroupData_MDL7 &, MDL::IntSharedData_MDL7 &, const unsigned char *, const unsigned char **)"
                 );
  }
  if (szCurrentOut == (uchar **)0x0) {
    __assert_fail("nullptr != szCurrentOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLLoader.cpp"
                  ,0x481,
                  "bool Assimp::MDLImporter::ProcessFrames_3DGS_MDL7(const MDL::IntGroupInfo_MDL7 &, MDL::IntGroupData_MDL7 &, MDL::IntSharedData_MDL7 &, const unsigned char *, const unsigned char **)"
                 );
  }
  puVar4 = this->mBuffer;
  uVar7 = 0;
  local_a0 = (Frame_MDL7 *)szCurrent;
  local_78 = szCurrentOut;
  local_70 = shared;
  do {
    uVar13 = groupInfo->pcGroup->numframes;
    uVar10 = (uint)uVar7;
    if (uVar13 <= uVar10) {
LAB_0043b0fa:
      *local_78 = (uchar *)local_a0;
      return uVar13 <= uVar10;
    }
    local_58.pcFrame = local_a0;
    uVar2 = *(ushort *)(puVar4 + 0x2e);
    uVar11 = local_a0->vertices_count;
    local_60 = (ulong)((uint)*(ushort *)(puVar4 + 0x2c) * local_a0->transmatrix_count +
                      *(ushort *)(puVar4 + 0x2a) * uVar11 + (uint)uVar2);
    local_58.iIndex = uVar10;
    if ((long)(ulong)*(uint *)(puVar4 + 0x10) < (long)((long)local_a0 + (local_60 - (long)puVar4)))
    {
      pLVar8 = DefaultLogger::get();
      Logger::warn(pLVar8,
                   "Index overflow in frame area. Ignoring all frames and all further mesh groups, too."
                  );
      goto LAB_0043b0fa;
    }
    local_68 = uVar7;
    if (local_88->configFrameID == uVar10) {
      for (uVar13 = 0; uVar13 < uVar11; uVar13 = uVar13 + 1) {
        uVar7 = (ulong)(*(ushort *)(puVar4 + 0x2a) * uVar13);
        uVar3 = *(ushort *)(local_a0->frame_name + uVar7 + (ulong)uVar2 + 0xc);
        if ((int)(uint)uVar3 < groupInfo->pcGroup->numverts) {
          local_98.x = 0.0;
          local_98.y = 0.0;
          local_98.z = 0.0;
          uVar1 = *(undefined8 *)(local_a0->frame_name + uVar7 + uVar2);
          uVar15 = (undefined4)((ulong)uVar1 >> 0x20);
          fVar16 = *(float *)(local_a0->frame_name + uVar7 + (ulong)uVar2 + 8);
          uVar14 = (int)uVar1;
          if (*(ushort *)(puVar4 + 0x28) < 0x1a) {
            if (0xf < *(ushort *)(puVar4 + 0x28)) {
              uStack_40 = 0;
              local_7c = fVar16;
              local_48 = uVar1;
              MD2::LookupNormalIndex(local_a0->frame_name[uVar7 + (ulong)uVar2 + 0xe],&local_98);
              uVar14 = (undefined4)local_48;
              uVar15 = local_48._4_4_;
              fVar16 = local_7c;
            }
          }
          else {
            local_98._0_8_ = *(undefined8 *)(local_a0->frame_name + uVar7 + (ulong)uVar2 + 0xe);
            local_98.z = *(float *)(local_a0->frame_name + uVar7 + (ulong)uVar2 + 0x16);
          }
          pTVar9 = groupInfo->pcGroupTris;
          uVar10 = 0;
          for (uVar11 = 0; uVar11 < (uint)groupInfo->pcGroup->numtris; uVar11 = uVar11 + 1) {
            for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
              if (pTVar9->v_index[lVar12] == uVar3) {
                uVar7 = (ulong)uVar10 + lVar12 & 0xffffffff;
                paVar5 = (groupData->vPositions).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                paVar6 = paVar5 + uVar7;
                paVar6->x = (float)uVar14;
                paVar6->y = (float)uVar15;
                paVar5[uVar7].z = fVar16;
                paVar6 = (groupData->vNormals).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                paVar6[uVar7].z = local_98.z;
                paVar6 = paVar6 + uVar7;
                paVar6->x = local_98.x;
                paVar6->y = local_98.y;
              }
            }
            pTVar9 = (Triangle_MDL7 *)((long)pTVar9->v_index + (ulong)*(ushort *)(puVar4 + 0x26));
            uVar10 = uVar10 + 3;
          }
        }
        else {
          pLVar8 = DefaultLogger::get();
          Logger::warn(pLVar8,"Invalid vertex index in frame vertex section");
        }
        uVar11 = local_a0->vertices_count;
      }
    }
    if (local_70->apcOutBones != (IntBone_MDL7 **)0x0) {
      ParseBoneTrafoKeys_3DGS_MDL7(local_88,groupInfo,&local_58,local_70);
    }
    local_a0 = (Frame_MDL7 *)(local_a0->frame_name + local_60);
    uVar7 = (ulong)((int)local_68 + 1);
  } while( true );
}

Assistant:

bool MDLImporter::ProcessFrames_3DGS_MDL7(const MDL::IntGroupInfo_MDL7& groupInfo,
    MDL::IntGroupData_MDL7&  groupData,
    MDL::IntSharedData_MDL7& shared,
    const unsigned char*     szCurrent,
    const unsigned char**    szCurrentOut)
{
    ai_assert( nullptr != szCurrent );
    ai_assert( nullptr != szCurrentOut);

    const MDL::Header_MDL7 *pcHeader = (const MDL::Header_MDL7*)mBuffer;

    // if we have no bones we can simply skip all frames,
    // otherwise we'll need to process them.
    // FIX: If we need another frame than the first we must apply frame vertex replacements ...
    for(unsigned int iFrame = 0; iFrame < (unsigned int)groupInfo.pcGroup->numframes;++iFrame)  {
        MDL::IntFrameInfo_MDL7 frame ((BE_NCONST MDL::Frame_MDL7*)szCurrent,iFrame);

        AI_SWAP4(frame.pcFrame->vertices_count);
        AI_SWAP4(frame.pcFrame->transmatrix_count);

        const unsigned int iAdd = pcHeader->frame_stc_size +
            frame.pcFrame->vertices_count * pcHeader->framevertex_stc_size +
            frame.pcFrame->transmatrix_count * pcHeader->bonetrans_stc_size;

        if (((const char*)szCurrent - (const char*)pcHeader) + iAdd > (unsigned int)pcHeader->data_size)    {
            ASSIMP_LOG_WARN("Index overflow in frame area. "
                "Ignoring all frames and all further mesh groups, too.");

            // don't parse more groups if we can't even read one
            // FIXME: sometimes this seems to occur even for valid files ...
            *szCurrentOut = szCurrent;
            return false;
        }
        // our output frame?
        if (configFrameID == iFrame)    {
            BE_NCONST MDL::Vertex_MDL7* pcFrameVertices = (BE_NCONST MDL::Vertex_MDL7*)(szCurrent+pcHeader->frame_stc_size);

            for (unsigned int qq = 0; qq < frame.pcFrame->vertices_count;++qq)  {
                // I assume this are simple replacements for normal vertices, the bone index serving
                // as the index of the vertex to be replaced.
                uint16_t iIndex = _AI_MDL7_ACCESS(pcFrameVertices,qq,pcHeader->framevertex_stc_size,MDL::Vertex_MDL7).vertindex;
                AI_SWAP2(iIndex);
                if (iIndex >= groupInfo.pcGroup->numverts)  {
                    ASSIMP_LOG_WARN("Invalid vertex index in frame vertex section");
                    continue;
                }

                aiVector3D vPosition,vNormal;

                vPosition.x = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .x;
                AI_SWAP4(vPosition.x);
                vPosition.y = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .y;
                AI_SWAP4(vPosition.y);
                vPosition.z = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .z;
                AI_SWAP4(vPosition.z);

                // now read the normal vector
                if (AI_MDL7_FRAMEVERTEX030305_STCSIZE <= pcHeader->mainvertex_stc_size) {
                    // read the full normal vector
                    vNormal.x = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .norm[0];
                    AI_SWAP4(vNormal.x);
                    vNormal.y = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .norm[1];
                    AI_SWAP4(vNormal.y);
                    vNormal.z = _AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,pcHeader->framevertex_stc_size) .norm[2];
                    AI_SWAP4(vNormal.z);
                }
                else if (AI_MDL7_FRAMEVERTEX120503_STCSIZE <= pcHeader->mainvertex_stc_size)    {
                    // read the normal vector from Quake2's smart table
                    MD2::LookupNormalIndex(_AI_MDL7_ACCESS_VERT(pcFrameVertices,qq,
                        pcHeader->framevertex_stc_size) .norm162index,vNormal);
                }

                // FIXME: O(n^2) at the moment ...
                BE_NCONST MDL::Triangle_MDL7* pcGroupTris = groupInfo.pcGroupTris;
                unsigned int iOutIndex = 0;
                for (unsigned int iTriangle = 0; iTriangle < (unsigned int)groupInfo.pcGroup->numtris; ++iTriangle) {
                    // iterate through all indices of the current triangle
                    for (unsigned int c = 0; c < 3;++c,++iOutIndex) {
                        // replace the vertex with the new data
                        const unsigned int iCurIndex = pcGroupTris->v_index[c];
                        if (iCurIndex == iIndex)    {
                            groupData.vPositions[iOutIndex] = vPosition;
                            groupData.vNormals[iOutIndex] = vNormal;
                        }
                    }
                    // get the next triangle in the list
                    pcGroupTris = (BE_NCONST MDL::Triangle_MDL7*)((const char*)
                        pcGroupTris + pcHeader->triangle_stc_size);
                }
            }
        }
        // parse bone trafo matrix keys (only if there are bones ...)
        if (shared.apcOutBones) {
            ParseBoneTrafoKeys_3DGS_MDL7(groupInfo,frame,shared);
        }
        szCurrent += iAdd;
    }
    *szCurrentOut = szCurrent;
    return true;
}